

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

size_t mbedtls_ssl_get_current_mtu(mbedtls_ssl_context *ssl)

{
  ushort uVar1;
  uint local_1c;
  mbedtls_ssl_context *ssl_local;
  
  if ((ssl->conf->endpoint == '\0') && ((ssl->state == 1 || (ssl->state == 2)))) {
    ssl_local = (mbedtls_ssl_context *)0x0;
  }
  else if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) || (ssl->handshake->mtu == 0)) {
    ssl_local = (mbedtls_ssl_context *)(ulong)ssl->mtu;
  }
  else if (ssl->mtu == 0) {
    ssl_local = (mbedtls_ssl_context *)(ulong)ssl->handshake->mtu;
  }
  else {
    if (ssl->mtu < ssl->handshake->mtu) {
      uVar1 = ssl->mtu;
    }
    else {
      uVar1 = ssl->handshake->mtu;
    }
    local_1c = (uint)uVar1;
    ssl_local = (mbedtls_ssl_context *)(long)(int)local_1c;
  }
  return (size_t)ssl_local;
}

Assistant:

size_t mbedtls_ssl_get_current_mtu(const mbedtls_ssl_context *ssl)
{
    /* Return unlimited mtu for client hello messages to avoid fragmentation. */
    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT &&
        (ssl->state == MBEDTLS_SSL_CLIENT_HELLO ||
         ssl->state == MBEDTLS_SSL_SERVER_HELLO)) {
        return 0;
    }

    if (ssl->handshake == NULL || ssl->handshake->mtu == 0) {
        return ssl->mtu;
    }

    if (ssl->mtu == 0) {
        return ssl->handshake->mtu;
    }

    return ssl->mtu < ssl->handshake->mtu ?
           ssl->mtu : ssl->handshake->mtu;
}